

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatLibraryPy.cpp
# Opt level: O0

void init_module_MatLibraryPy(void)

{
  class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  *pcVar1;
  class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  *pcVar2;
  enum_<mat_lib::format> *peVar3;
  enum_<mat_lib::format> local_570 [2];
  vector<double> local_560;
  def_visitor<boost::python::detail::operator_<(boost::python::detail::operator_id)26,_boost::python::self_ns::self_t,_mat_lib::vector<double>_>_>
  local_532 [2];
  vector<double> local_530;
  def_visitor<boost::python::detail::operator_<(boost::python::detail::operator_id)30,_boost::python::self_ns::self_t,_mat_lib::vector<double>_>_>
  local_502 [2];
  vector<double> local_500;
  def_visitor<boost::python::detail::operator_<(boost::python::detail::operator_id)25,_boost::python::self_ns::self_t,_mat_lib::vector<double>_>_>
  local_4d2 [2];
  vector<double> local_4d0;
  def_visitor<boost::python::detail::operator_<(boost::python::detail::operator_id)28,_boost::python::self_ns::self_t,_mat_lib::vector<double>_>_>
  local_4a2 [2];
  vector<double> local_4a0;
  def_visitor<boost::python::detail::operator_<(boost::python::detail::operator_id)27,_boost::python::self_ns::self_t,_mat_lib::vector<double>_>_>
  local_472 [2];
  double local_470;
  def_visitor<boost::python::detail::operator_<(boost::python::detail::operator_id)40,_boost::python::self_ns::self_t,_double>_>
  local_462 [2];
  vector<double> local_460;
  def_visitor<boost::python::detail::operator_<(boost::python::detail::operator_id)40,_boost::python::self_ns::self_t,_mat_lib::vector<double>_>_>
  local_432 [2];
  double local_430;
  def_visitor<boost::python::detail::operator_<(boost::python::detail::operator_id)2,_boost::python::self_ns::self_t,_double>_>
  local_422 [2];
  vector<double> local_420;
  def_visitor<boost::python::detail::operator_<(boost::python::detail::operator_id)2,_boost::python::self_ns::self_t,_mat_lib::vector<double>_>_>
  local_3f2 [2];
  double local_3f0;
  def_visitor<boost::python::detail::operator_<(boost::python::detail::operator_id)1,_boost::python::self_ns::self_t,_double>_>
  local_3e2 [2];
  vector<double> local_3e0;
  def_visitor<boost::python::detail::operator_<(boost::python::detail::operator_id)1,_boost::python::self_ns::self_t,_mat_lib::vector<double>_>_>
  local_3b2 [2];
  double local_3b0;
  def_visitor<boost::python::detail::operator_<(boost::python::detail::operator_id)0,_boost::python::self_ns::self_t,_double>_>
  local_3a2 [2];
  vector<double> local_3a0;
  def_visitor<boost::python::detail::operator_<(boost::python::detail::operator_id)0,_boost::python::self_ns::self_t,_mat_lib::vector<double>_>_>
  local_371;
  code *local_370;
  undefined8 local_368;
  code *local_360;
  undefined8 local_358;
  code *local_350;
  undefined8 local_348;
  code *local_340;
  undefined8 local_338;
  code *local_330;
  undefined8 local_328;
  code *local_320;
  undefined8 local_318;
  code *local_310;
  undefined8 local_308;
  code *local_300;
  undefined8 local_2f8;
  code *local_2f0;
  undefined8 local_2e8;
  code *local_2e0;
  undefined8 local_2d8;
  code *local_2d0;
  undefined8 local_2c8;
  init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>
  local_2c0;
  init<boost::python::list,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>
  local_2a8;
  init_base<boost::python::init<int,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>_>
  local_290;
  class_<mat_lib::vector<double>,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
  local_278;
  code *local_270;
  undefined8 local_268;
  code *local_260;
  undefined8 local_258;
  code *local_250;
  undefined8 local_248;
  code *local_240;
  undefined8 local_238;
  code *local_230;
  undefined8 local_228;
  code *local_220;
  undefined8 local_218;
  code *local_210;
  undefined8 local_208;
  code *local_200;
  undefined8 local_1f8;
  code *local_1f0;
  undefined8 local_1e8;
  code *local_1e0;
  undefined8 local_1d8;
  matrix<double> local_1c8;
  def_visitor<boost::python::detail::operator_<(boost::python::detail::operator_id)25,_boost::python::self_ns::self_t,_mat_lib::matrix<double>_>_>
  local_1a2 [2];
  matrix<double> local_1a0;
  def_visitor<boost::python::detail::operator_<(boost::python::detail::operator_id)28,_boost::python::self_ns::self_t,_mat_lib::matrix<double>_>_>
  local_17a [2];
  matrix<double> local_178;
  def_visitor<boost::python::detail::operator_<(boost::python::detail::operator_id)27,_boost::python::self_ns::self_t,_mat_lib::matrix<double>_>_>
  local_152 [2];
  matrix<double> local_150;
  def_visitor<boost::python::detail::operator_<(boost::python::detail::operator_id)2,_boost::python::self_ns::self_t,_mat_lib::matrix<double>_>_>
  local_12a [2];
  double local_128;
  def_visitor<boost::python::detail::operator_<(boost::python::detail::operator_id)40,_double,_boost::python::self_ns::self_t>_>
  local_11a [2];
  double local_118;
  def_visitor<boost::python::detail::operator_<(boost::python::detail::operator_id)40,_boost::python::self_ns::self_t,_double>_>
  local_10a [2];
  matrix<double> local_108;
  def_visitor<boost::python::detail::operator_<(boost::python::detail::operator_id)1,_boost::python::self_ns::self_t,_mat_lib::matrix<double>_>_>
  local_e2 [2];
  matrix<double> local_e0;
  def_visitor<boost::python::detail::operator_<(boost::python::detail::operator_id)0,_boost::python::self_ns::self_t,_mat_lib::matrix<double>_>_>
  local_b9;
  code *local_b8;
  undefined8 local_b0;
  code *local_a8;
  undefined8 local_a0;
  init<mat_lib::matrix<double>,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>
  local_98;
  init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>
  local_80;
  init<boost::python::list,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>
  local_68;
  init<int,_int,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>
  local_40;
  init_base<boost::python::init<mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>_>
  local_28;
  class_<mat_lib::matrix<double>,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
  local_10;
  
  boost::python::
  init<mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>
  ::init((init<mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>
          *)&local_28,(EVP_PKEY_CTX *)0x0);
  boost::python::
  class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  class_<boost::python::init<mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>
            ((class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              *)&local_10,"Matrix",&local_28);
  boost::python::
  init<int,_int,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>
  ::init(&local_40,(EVP_PKEY_CTX *)0x0);
  pcVar1 = (class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::
              def<boost::python::init<int,int,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>
                        ((class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
                          *)&local_10,
                         (def_visitor<boost::python::init<int,_int,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>_>
                          *)&local_40);
  boost::python::
  init<boost::python::list,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>
  ::init(&local_68,(EVP_PKEY_CTX *)0x0);
  pcVar1 = (class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::
              def<boost::python::init<boost::python::list,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>
                        (pcVar1,(def_visitor<boost::python::init<boost::python::list,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>_>
                                 *)&local_68);
  boost::python::
  init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>
  ::init(&local_80,(EVP_PKEY_CTX *)0x0);
  pcVar1 = (class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::
              def<boost::python::init<std::__cxx11::string,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>
                        (pcVar1,(def_visitor<boost::python::init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>_>
                                 *)&local_80);
  boost::python::
  init<mat_lib::matrix<double>,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>
  ::init(&local_98,(EVP_PKEY_CTX *)0x0);
  pcVar1 = (class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::
              def<boost::python::init<mat_lib::matrix<double>,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>
                        (pcVar1,(def_visitor<boost::python::init<mat_lib::matrix<double>,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>_>
                                 *)&local_98);
  local_a8 = mat_lib::matrix<double>::str_abi_cxx11_;
  local_a0 = 0;
  pcVar1 = (class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<std::__cxx11::string(mat_lib::matrix<double>::*)()const>
                        (pcVar1,"__str__",(first_type)mat_lib::matrix<double>::str_abi_cxx11_);
  local_b8 = mat_lib::matrix<double>::repr_abi_cxx11_;
  local_b0 = 0;
  pcVar1 = (class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<std::__cxx11::string(mat_lib::matrix<double>::*)()const>
                        (pcVar1,"__repr__",(first_type)mat_lib::matrix<double>::repr_abi_cxx11_);
  mat_lib::matrix<double>::matrix(&local_e0);
  boost::python::self_ns::operator+((self_t *)&boost::python::self_ns::self,&local_e0);
  pcVar1 = (class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::
              def<boost::python::detail::operator_<(boost::python::detail::operator_id)0,boost::python::self_ns::self_t,mat_lib::matrix<double>>>
                        (pcVar1,&local_b9);
  mat_lib::matrix<double>::matrix(&local_108);
  boost::python::self_ns::operator-((self_t *)&boost::python::self_ns::self,&local_108);
  pcVar1 = (class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::
              def<boost::python::detail::operator_<(boost::python::detail::operator_id)1,boost::python::self_ns::self_t,mat_lib::matrix<double>>>
                        (pcVar1,local_e2);
  local_118 = 0.0;
  boost::python::self_ns::operator/((self_t *)&boost::python::self_ns::self,&local_118);
  pcVar1 = (class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::
              def<boost::python::detail::operator_<(boost::python::detail::operator_id)40,boost::python::self_ns::self_t,double>>
                        (pcVar1,local_10a);
  local_128 = 0.0;
  boost::python::self_ns::operator/(&local_128,(self_t *)&boost::python::self_ns::self);
  pcVar1 = (class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::
              def<boost::python::detail::operator_<(boost::python::detail::operator_id)40,double,boost::python::self_ns::self_t>>
                        (pcVar1,local_11a);
  mat_lib::matrix<double>::matrix(&local_150);
  boost::python::self_ns::operator*((self_t *)&boost::python::self_ns::self,&local_150);
  pcVar1 = (class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::
              def<boost::python::detail::operator_<(boost::python::detail::operator_id)2,boost::python::self_ns::self_t,mat_lib::matrix<double>>>
                        (pcVar1,local_12a);
  mat_lib::matrix<double>::matrix(&local_178);
  boost::python::self_ns::operator+=((self_t *)&boost::python::self_ns::self,&local_178);
  pcVar1 = (class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::
              def<boost::python::detail::operator_<(boost::python::detail::operator_id)27,boost::python::self_ns::self_t,mat_lib::matrix<double>>>
                        (pcVar1,local_152);
  mat_lib::matrix<double>::matrix(&local_1a0);
  boost::python::self_ns::operator-=((self_t *)&boost::python::self_ns::self,&local_1a0);
  pcVar1 = (class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::
              def<boost::python::detail::operator_<(boost::python::detail::operator_id)28,boost::python::self_ns::self_t,mat_lib::matrix<double>>>
                        (pcVar1,local_17a);
  mat_lib::matrix<double>::matrix(&local_1c8);
  boost::python::self_ns::operator==((self_t *)&boost::python::self_ns::self,&local_1c8);
  pcVar1 = (class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::
              def<boost::python::detail::operator_<(boost::python::detail::operator_id)25,boost::python::self_ns::self_t,mat_lib::matrix<double>>>
                        (pcVar1,local_1a2);
  local_1e0 = mat_lib::matrix<double>::size;
  local_1d8 = 0;
  pcVar1 = (class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<unsigned_long(mat_lib::matrix<double>::*)()const>
                        (pcVar1,"size",(first_type)mat_lib::matrix<double>::size);
  local_1f0 = mat_lib::matrix<double>::rows;
  local_1e8 = 0;
  pcVar1 = (class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<unsigned_long(mat_lib::matrix<double>::*)()const>
                        (pcVar1,"rows",(first_type)mat_lib::matrix<double>::rows);
  local_200 = mat_lib::matrix<double>::columns;
  local_1f8 = 0;
  pcVar1 = (class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<unsigned_long(mat_lib::matrix<double>::*)()const>
                        (pcVar1,"columns",(first_type)mat_lib::matrix<double>::columns);
  local_210 = mat_lib::matrix<double>::get;
  local_208 = 0;
  pcVar1 = (class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<double(mat_lib::matrix<double>::*)(unsigned_long,unsigned_long)const>
                        (pcVar1,"get",(first_type)mat_lib::matrix<double>::get);
  local_220 = mat_lib::matrix<double>::set;
  local_218 = 0;
  pcVar1 = (class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<void(mat_lib::matrix<double>::*)(unsigned_long,unsigned_long,double)>
                        (pcVar1,"set",(first_type)mat_lib::matrix<double>::set);
  local_230 = mat_lib::matrix<double>::inverse;
  local_228 = 0;
  pcVar1 = (class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<mat_lib::matrix<double>(mat_lib::matrix<double>::*)()>
                        (pcVar1,"inv",(first_type)mat_lib::matrix<double>::inverse);
  local_240 = mat_lib::matrix<double>::make_transpose;
  local_238 = 0;
  pcVar1 = (class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<mat_lib::matrix<double>(mat_lib::matrix<double>::*)()const>
                        (pcVar1,"transpose",(first_type)mat_lib::matrix<double>::make_transpose);
  local_250 = mat_lib::base_matrix<double>::setFractionalDigits;
  local_248 = 0;
  pcVar1 = (class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<void(mat_lib::base_matrix<double>::*)(int)>
                        (pcVar1,"setFractionalDigits",
                         (first_type)mat_lib::base_matrix<double>::setFractionalDigits);
  local_260 = mat_lib::base_matrix<double>::setFormat;
  local_258 = 0;
  pcVar1 = (class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<void(mat_lib::base_matrix<double>::*)(mat_lib::format)>
                        (pcVar1,"setFormat",(first_type)mat_lib::base_matrix<double>::setFormat);
  local_270 = mat_lib::matrix<double>::save_as;
  local_268 = 0;
  boost::python::
  class_<mat_lib::matrix<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<void(mat_lib::matrix<double>::*)(std::__cxx11::string_const&)const>
            (pcVar1,"saveAs",(first_type)mat_lib::matrix<double>::save_as);
  mat_lib::matrix<double>::~matrix(&local_1c8);
  mat_lib::matrix<double>::~matrix(&local_1a0);
  mat_lib::matrix<double>::~matrix(&local_178);
  mat_lib::matrix<double>::~matrix(&local_150);
  mat_lib::matrix<double>::~matrix(&local_108);
  mat_lib::matrix<double>::~matrix(&local_e0);
  boost::python::
  class_<mat_lib::matrix<double>,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
  ::~class_(&local_10);
  boost::python::
  init<int,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>
  ::init((init<int,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>
          *)&local_290,(EVP_PKEY_CTX *)0x0);
  boost::python::
  class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  class_<boost::python::init<int,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>
            ((class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              *)&local_278,"Vector",&local_290);
  boost::python::
  init<boost::python::list,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>
  ::init(&local_2a8,(EVP_PKEY_CTX *)0x0);
  pcVar2 = (class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::
              def<boost::python::init<boost::python::list,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>
                        ((class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
                          *)&local_278,
                         (def_visitor<boost::python::init<boost::python::list,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>_>
                          *)&local_2a8);
  boost::python::
  init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>
  ::init(&local_2c0,(EVP_PKEY_CTX *)0x0);
  pcVar2 = (class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::
              def<boost::python::init<std::__cxx11::string,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>
                        (pcVar2,(def_visitor<boost::python::init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>_>
                                 *)&local_2c0);
  local_2d0 = mat_lib::vector<double>::str_abi_cxx11_;
  local_2c8 = 0;
  pcVar2 = (class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<std::__cxx11::string(mat_lib::vector<double>::*)()const>
                        (pcVar2,"__str__",(first_type)mat_lib::vector<double>::str_abi_cxx11_);
  local_2e0 = mat_lib::vector<double>::repr_abi_cxx11_;
  local_2d8 = 0;
  pcVar2 = (class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<std::__cxx11::string(mat_lib::vector<double>::*)()const>
                        (pcVar2,"__repr__",(first_type)mat_lib::vector<double>::repr_abi_cxx11_);
  local_2f0 = mat_lib::vector<double>::save_as;
  local_2e8 = 0;
  pcVar2 = (class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<void(mat_lib::vector<double>::*)(std::__cxx11::string_const&)const>
                        (pcVar2,"saveAs",(first_type)mat_lib::vector<double>::save_as);
  local_300 = mat_lib::vector<double>::size;
  local_2f8 = 0;
  pcVar2 = (class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<unsigned_long(mat_lib::vector<double>::*)()const>
                        (pcVar2,"size",(first_type)mat_lib::vector<double>::size);
  local_310 = mat_lib::vector<double>::define_random;
  local_308 = 0;
  pcVar2 = (class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<void(mat_lib::vector<double>::*)()>
                        (pcVar2,"random",(first_type)mat_lib::vector<double>::define_random);
  local_320 = mat_lib::vector<double>::define_value;
  local_318 = 0;
  pcVar2 = (class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<void(mat_lib::vector<double>::*)(int)>
                        (pcVar2,"define",(first_type)mat_lib::vector<double>::define_value);
  local_330 = mat_lib::vector<double>::is_empty;
  local_328 = 0;
  pcVar2 = (class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<bool(mat_lib::vector<double>::*)()const>
                        (pcVar2,"isEmpty",(first_type)mat_lib::vector<double>::is_empty);
  local_340 = mat_lib::vector<double>::set;
  local_338 = 0;
  pcVar2 = (class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<void(mat_lib::vector<double>::*)(unsigned_long,double)>
                        (pcVar2,"set",(first_type)mat_lib::vector<double>::set);
  local_350 = mat_lib::vector<double>::get;
  local_348 = 0;
  pcVar2 = (class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<double(mat_lib::vector<double>::*)(unsigned_long)>
                        (pcVar2,"get",(first_type)mat_lib::vector<double>::get);
  local_360 = mat_lib::vector<double>::setFractionalDigits;
  local_358 = 0;
  pcVar2 = (class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<void(mat_lib::vector<double>::*)(int)>
                        (pcVar2,"setFractionalDigits",
                         (first_type)mat_lib::vector<double>::setFractionalDigits);
  local_370 = mat_lib::vector<double>::setFormat;
  local_368 = 0;
  pcVar2 = (class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<void(mat_lib::vector<double>::*)(mat_lib::format)>
                        (pcVar2,"setFormat",(first_type)mat_lib::vector<double>::setFormat);
  mat_lib::vector<double>::vector(&local_3a0);
  boost::python::self_ns::operator+((self_t *)&boost::python::self_ns::self,&local_3a0);
  pcVar2 = (class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::
              def<boost::python::detail::operator_<(boost::python::detail::operator_id)0,boost::python::self_ns::self_t,mat_lib::vector<double>>>
                        (pcVar2,&local_371);
  local_3b0 = 0.0;
  boost::python::self_ns::operator+((self_t *)&boost::python::self_ns::self,&local_3b0);
  pcVar2 = (class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::
              def<boost::python::detail::operator_<(boost::python::detail::operator_id)0,boost::python::self_ns::self_t,double>>
                        (pcVar2,local_3a2);
  mat_lib::vector<double>::vector(&local_3e0);
  boost::python::self_ns::operator-((self_t *)&boost::python::self_ns::self,&local_3e0);
  pcVar2 = (class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::
              def<boost::python::detail::operator_<(boost::python::detail::operator_id)1,boost::python::self_ns::self_t,mat_lib::vector<double>>>
                        (pcVar2,local_3b2);
  local_3f0 = 0.0;
  boost::python::self_ns::operator-((self_t *)&boost::python::self_ns::self,&local_3f0);
  pcVar2 = (class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::
              def<boost::python::detail::operator_<(boost::python::detail::operator_id)1,boost::python::self_ns::self_t,double>>
                        (pcVar2,local_3e2);
  mat_lib::vector<double>::vector(&local_420);
  boost::python::self_ns::operator*((self_t *)&boost::python::self_ns::self,&local_420);
  pcVar2 = (class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::
              def<boost::python::detail::operator_<(boost::python::detail::operator_id)2,boost::python::self_ns::self_t,mat_lib::vector<double>>>
                        (pcVar2,local_3f2);
  local_430 = 0.0;
  boost::python::self_ns::operator*((self_t *)&boost::python::self_ns::self,&local_430);
  pcVar2 = (class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::
              def<boost::python::detail::operator_<(boost::python::detail::operator_id)2,boost::python::self_ns::self_t,double>>
                        (pcVar2,local_422);
  mat_lib::vector<double>::vector(&local_460);
  boost::python::self_ns::operator/((self_t *)&boost::python::self_ns::self,&local_460);
  pcVar2 = (class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::
              def<boost::python::detail::operator_<(boost::python::detail::operator_id)40,boost::python::self_ns::self_t,mat_lib::vector<double>>>
                        (pcVar2,local_432);
  local_470 = 0.0;
  boost::python::self_ns::operator/((self_t *)&boost::python::self_ns::self,&local_470);
  pcVar2 = (class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::
              def<boost::python::detail::operator_<(boost::python::detail::operator_id)40,boost::python::self_ns::self_t,double>>
                        (pcVar2,local_462);
  mat_lib::vector<double>::vector(&local_4a0);
  boost::python::self_ns::operator+=((self_t *)&boost::python::self_ns::self,&local_4a0);
  pcVar2 = (class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::
              def<boost::python::detail::operator_<(boost::python::detail::operator_id)27,boost::python::self_ns::self_t,mat_lib::vector<double>>>
                        (pcVar2,local_472);
  mat_lib::vector<double>::vector(&local_4d0);
  boost::python::self_ns::operator-=((self_t *)&boost::python::self_ns::self,&local_4d0);
  pcVar2 = (class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::
              def<boost::python::detail::operator_<(boost::python::detail::operator_id)28,boost::python::self_ns::self_t,mat_lib::vector<double>>>
                        (pcVar2,local_4a2);
  mat_lib::vector<double>::vector(&local_500);
  boost::python::self_ns::operator==((self_t *)&boost::python::self_ns::self,&local_500);
  pcVar2 = (class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::
              def<boost::python::detail::operator_<(boost::python::detail::operator_id)25,boost::python::self_ns::self_t,mat_lib::vector<double>>>
                        (pcVar2,local_4d2);
  mat_lib::vector<double>::vector(&local_530);
  boost::python::self_ns::operator/=((self_t *)&boost::python::self_ns::self,&local_530);
  pcVar2 = (class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::
              def<boost::python::detail::operator_<(boost::python::detail::operator_id)30,boost::python::self_ns::self_t,mat_lib::vector<double>>>
                        (pcVar2,local_502);
  mat_lib::vector<double>::vector(&local_560);
  boost::python::self_ns::operator!=((self_t *)&boost::python::self_ns::self,&local_560);
  boost::python::
  class_<mat_lib::vector<double>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  def<boost::python::detail::operator_<(boost::python::detail::operator_id)26,boost::python::self_ns::self_t,mat_lib::vector<double>>>
            (pcVar2,local_532);
  mat_lib::vector<double>::~vector(&local_560);
  mat_lib::vector<double>::~vector(&local_530);
  mat_lib::vector<double>::~vector(&local_500);
  mat_lib::vector<double>::~vector(&local_4d0);
  mat_lib::vector<double>::~vector(&local_4a0);
  mat_lib::vector<double>::~vector(&local_460);
  mat_lib::vector<double>::~vector(&local_420);
  mat_lib::vector<double>::~vector(&local_3e0);
  mat_lib::vector<double>::~vector(&local_3a0);
  boost::python::
  class_<mat_lib::vector<double>,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
  ::~class_(&local_278);
  boost::python::enum_<mat_lib::format>::enum_(local_570,"Format",(char *)0x0);
  peVar3 = boost::python::enum_<mat_lib::format>::value(local_570,"fixed",fixed);
  peVar3 = boost::python::enum_<mat_lib::format>::value(peVar3,"scientific",scientific);
  boost::python::enum_<mat_lib::format>::export_values(peVar3);
  boost::python::enum_<mat_lib::format>::~enum_(local_570);
  return;
}

Assistant:

BOOST_PYTHON_MODULE(MatLibraryPy)
{
    class_<matrix<double>>("Matrix", init<>())
        .def(init<int,int>())
        .def(init<boost::python::list>())
        .def(init<string>())
        .def(init<matrix<double>>())
        .def("__str__", &matrix<double>::str)
        .def("__repr__", &matrix<double>::repr)
        .def(self + matrix<double>())
        .def(self - matrix<double>())
        .def(self  / double())
        .def(double() / self)
        .def(self * matrix<double>())
        .def(self += matrix<double>())
        .def(self -= matrix<double>())
        .def(self == matrix<double>())
        .def("size", &matrix<double>::size)
        .def("rows", &matrix<double>::rows)
        .def("columns", &matrix<double>::columns)
        .def("get", &matrix<double>::get)
        .def("set", &matrix<double>::set)
        .def("inv", &matrix<double>::inverse)
        .def("transpose", &matrix<double>::make_transpose)
        .def("setFractionalDigits", &matrix<double>::setFractionalDigits)
        .def("setFormat", &matrix<double>::setFormat)
        .def("saveAs", &matrix<double>::save_as)
    ;

    class_<mat_lib::vector<double>>("Vector", init<int>())
        .def(init<boost::python::list>())
        .def(init<string>())
        .def("__str__", &mat_lib::vector<double>::str)
        .def("__repr__", &mat_lib::vector<double>::repr)
        .def("saveAs", &mat_lib::vector<double>::save_as)
        .def("size", &mat_lib::vector<double>::size)
        .def("random", &mat_lib::vector<double>::define_random)
        .def("define", &mat_lib::vector<double>::define_value)
        .def("isEmpty", &mat_lib::vector<double>::is_empty)
        .def("set", &mat_lib::vector<double>::set)
        .def("get", &mat_lib::vector<double>::get)
        .def("setFractionalDigits", &mat_lib::vector<double>::setFractionalDigits)
        .def("setFormat", &mat_lib::vector<double>::setFormat)
        .def(self + mat_lib::vector<double>())
        .def(self + double())
        .def(self - mat_lib::vector<double>())
        .def(self - double())
        .def(self * mat_lib::vector<double>())
        .def(self * double())
        .def(self / mat_lib::vector<double>())
        .def(self / double())
        .def(self += mat_lib::vector<double>())
        .def(self -= mat_lib::vector<double>())
        .def(self == mat_lib::vector<double>())
        .def(self /= mat_lib::vector<double>())
        .def(self != mat_lib::vector<double>())
    ;

    enum_<format>("Format")
        .value("fixed", mat_lib::fixed)
        .value("scientific", mat_lib::scientific)
        .export_values()
    ;
}